

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntWeakPtr<Diligent::DeviceContextVkImpl> * __thiscall
Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>::operator=
          (RefCntWeakPtr<Diligent::DeviceContextVkImpl> *this,DeviceContextVkImpl *pObj)

{
  RefCntWeakPtr<Diligent::DeviceContextVkImpl> *pRVar1;
  RefCntWeakPtr<Diligent::DeviceContextVkImpl> local_28;
  DeviceContextVkImpl *local_18;
  DeviceContextVkImpl *pObj_local;
  RefCntWeakPtr<Diligent::DeviceContextVkImpl> *this_local;
  
  local_18 = pObj;
  pObj_local = (DeviceContextVkImpl *)this;
  RefCntWeakPtr(&local_28,pObj);
  pRVar1 = operator=(this,&local_28);
  ~RefCntWeakPtr(&local_28);
  return pRVar1;
}

Assistant:

RefCntWeakPtr& operator=(T* pObj) noexcept
    {
        return operator=(RefCntWeakPtr(pObj));
    }